

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

int __thiscall
jsoncons::jsonpath::detail::
filter_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(filter_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  undefined7 extraout_var_00;
  key_type *this_00;
  undefined4 in_register_00000034;
  iterator iVar4;
  undefined4 in_stack_00000008;
  bool t_1;
  value_type r_1;
  error_code ec_1;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *member;
  iterator __end0;
  iterator __begin0;
  const_object_range_type *__range5;
  bool t;
  value_type r;
  error_code ec;
  size_t i;
  result_options in_stack_0000019c;
  reference in_stack_000001a0;
  reference in_stack_000001a8;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_000001b0;
  token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_000001b8;
  error_code *in_stack_000001d0;
  error_code *in_stack_fffffffffffffe48;
  undefined4 uVar5;
  error_code *in_stack_fffffffffffffe50;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *identifier;
  path_node_type *in_stack_fffffffffffffe60;
  path_node_type *last;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  undefined1 uVar6;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe78;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *context;
  base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe80;
  base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *this_01;
  undefined8 in_stack_fffffffffffffe90;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  *this_02;
  bool local_141;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  error_code local_f0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_e0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_d8;
  undefined1 local_d0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_c8;
  undefined1 local_c0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_b8;
  undefined1 local_b0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_a8;
  undefined1 local_a0;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_98;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  *local_78;
  bool local_59;
  error_code local_48;
  ulong local_38;
  timeval *local_30;
  fd_set *local_28;
  path_node_type *local_20;
  error_code *local_18;
  base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_10;
  filter_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_8;
  undefined7 extraout_var;
  
  local_10 = (base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)CONCAT44(in_register_00000034,__nfds);
  local_30 = __timeout;
  local_28 = __exceptfds;
  local_20 = (path_node_type *)__writefds;
  local_18 = (error_code *)__readfds;
  local_8 = this;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe68);
  if (bVar1) {
    for (local_38 = 0; uVar3 = local_38,
        sVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                          (in_stack_fffffffffffffe58), uVar3 < sVar2; local_38 = local_38 + 1) {
      std::error_code::error_code(in_stack_fffffffffffffe50);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe48 = &local_48;
      token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
      ::evaluate(in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
                 in_stack_0000019c,in_stack_000001d0);
      bVar1 = std::error_code::operator_cast_to_bool(&local_48);
      if (bVar1) {
        local_141 = false;
      }
      else {
        local_141 = is_true<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                               0x5af8f5);
      }
      local_59 = local_141;
      if (local_141 != false) {
        path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::generate(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                   (size_t)in_stack_fffffffffffffe58,
                   (result_options)((ulong)in_stack_fffffffffffffe50 >> 0x20));
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe48 =
             (error_code *)
             CONCAT44((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_00000008);
        base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::tail_select(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                      (reference)
                      CONCAT17(in_stack_fffffffffffffe77,
                               CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
                      (path_node_type *)in_stack_fffffffffffffe68,
                      (reference)in_stack_fffffffffffffe60,
                      (node_receiver_type *)in_stack_fffffffffffffe58,
                      (result_options)in_stack_fffffffffffffe90);
      }
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x5af9e7);
    }
  }
  else {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe68);
    uVar3 = CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      this_02 = &local_98;
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                (in_stack_ffffffffffffff00);
      local_78 = this_02;
      iVar4 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
              ::begin(this_02);
      local_b8 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)iVar4.it_._M_current;
      local_b0 = iVar4.has_value_;
      local_a8 = local_b8;
      local_a0 = local_b0;
      iVar4 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
              ::end(local_78);
      local_d8 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)iVar4.it_._M_current;
      local_d0 = iVar4.has_value_;
      local_c8 = local_d8;
      local_c0 = local_d0;
      while( true ) {
        bVar1 = jsoncons::detail::
                random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                ::operator!=((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                              *)in_stack_fffffffffffffe50,
                             (random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                              *)in_stack_fffffffffffffe48);
        uVar3 = CONCAT71(extraout_var_00,bVar1);
        if (!bVar1) break;
        local_e0 = jsoncons::detail::
                   random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                   ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                *)0x5afae1);
        std::error_code::error_code(in_stack_fffffffffffffe50);
        context = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   *)&this->expr_;
        this_01 = local_10;
        key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::value(local_e0);
        in_stack_fffffffffffffe48 = &local_f0;
        token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::evaluate(in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
                   in_stack_0000019c,in_stack_000001d0);
        bVar1 = std::error_code::operator_cast_to_bool(&local_f0);
        if (bVar1) {
          uVar6 = false;
        }
        else {
          in_stack_fffffffffffffe76 =
               is_true<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          0x5afb89);
          uVar6 = in_stack_fffffffffffffe76;
        }
        if ((bool)uVar6 != false) {
          in_stack_fffffffffffffe50 = local_18;
          identifier = local_10;
          last = local_20;
          this_00 = key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::key(local_e0);
          uVar5 = (undefined4)((ulong)in_stack_fffffffffffffe48 >> 0x20);
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
          in_stack_fffffffffffffe68 =
               (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                *)path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                  ::generate(in_stack_fffffffffffffe68,last,(string_view_type *)identifier,
                             (result_options)((ulong)in_stack_fffffffffffffe50 >> 0x20));
          key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::value(local_e0);
          in_stack_fffffffffffffe48 = (error_code *)CONCAT44(uVar5,in_stack_00000008);
          base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::tail_select(this_01,context,
                        (reference)
                        CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)
                                ),(path_node_type *)in_stack_fffffffffffffe68,(reference)last,
                        (node_receiver_type *)identifier,(result_options)this_02);
        }
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x5afc9b);
        jsoncons::detail::
        random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
        ::operator++((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                      *)in_stack_fffffffffffffe50);
      }
    }
  }
  return (int)uVar3;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current, 
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                for (std::size_t i = 0; i < current.size(); ++i)
                {
                    std::error_code ec;
                    value_type r = expr_.evaluate(context, root, current[i], options, ec);
                    bool t = ec ? false : detail::is_true(r);
                    if (t)
                    {
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, i, options), 
                                            current[i], receiver, options);
                    }
                }
            }
            else if (current.is_object())
            {
                for (auto& member : current.object_range())
                {
                    std::error_code ec;
                    value_type r = expr_.evaluate(context, root, member.value(), options, ec);
                    bool t = ec ? false : detail::is_true(r);
                    if (t)
                    {
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, member.key(), options), 
                                            member.value(), receiver, options);
                    }
                }
            }
        }